

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Mode __thiscall
Catch::Clara::Parser::handleOpt
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  string optName;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  string *local_38;
  
  local_90 = 0x3d3a;
  local_98._M_p = (pointer)0x3;
  local_a0 = (undefined1  [8])&local_90;
  local_38 = arg;
  lVar1 = std::__cxx11::string::find((char)local_a0,CONCAT71(in_register_00000011,c) & 0xffffffff);
  if (local_a0 != (undefined1  [8])&local_90) {
    operator_delete((void *)local_a0,CONCAT44(uStack_8c,local_90) + 1);
  }
  if (lVar1 == -1) {
    return this->mode;
  }
  std::__cxx11::string::substr((ulong)&local_78,(ulong)local_38);
  if (this->mode == SlashOpt) {
    if (local_70 != 1) goto LAB_00147357;
    local_a0._0_4_ = 1;
    local_98._M_p = (pointer)&local_88;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,(long)local_78 + 1);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_a0);
  }
  else {
    if (this->mode == ShortOpt) {
      if (local_70 != 0) {
        uVar2 = 0;
        do {
          std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_78);
          local_a0._0_4_ = 1;
          local_98._M_p = (pointer)&local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,local_58,local_50 + (long)local_58);
          std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
          emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_p != &local_88) {
            operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
          }
          if (local_58 != local_48) {
            operator_delete(local_58,local_48[0] + 1);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_70);
      }
      goto LAB_001473a2;
    }
LAB_00147357:
    local_a0._0_4_ = 2;
    local_98._M_p = (pointer)&local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_78,local_70 + (long)local_78);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
LAB_001473a2:
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return None;
}

Assistant:

Mode handleOpt( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( std::string( ":=\0", 3 ).find( c ) == std::string::npos )
                return mode;

            std::string optName = arg.substr( from, i-from );
            if( mode == ShortOpt )
                for( std::size_t j = 0; j < optName.size(); ++j )
                    tokens.push_back( Token( Token::ShortOpt, optName.substr( j, 1 ) ) );
            else if( mode == SlashOpt && optName.size() == 1 )
                tokens.push_back( Token( Token::ShortOpt, optName ) );
            else
                tokens.push_back( Token( Token::LongOpt, optName ) );
            return None;
        }